

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

QPDFObjectHandle __thiscall
NNTreeIterator::getNextKid(NNTreeIterator *this,PathElement *pe,bool backward)

{
  int iVar1;
  QPDF *qpdf;
  bool bVar2;
  int iVar3;
  string *key;
  int in_ECX;
  undefined7 in_register_00000011;
  string *key_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar4;
  QPDFObjectHandle kids;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  QPDFObjectHandle local_60;
  string local_50;
  
  key_00 = (string *)CONCAT71(in_register_00000011,backward);
  this->_vptr_NNTreeIterator = (_func_int **)0x0;
  this->impl = (NNTreeImpl *)0x0;
  while( true ) {
    *(uint *)&key_00->field_2 = *(int *)&key_00->field_2 + (-in_ECX | 1U);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"/Kids",(allocator<char> *)&local_50);
    QPDFObjectHandle::getKey(&local_60,key_00);
    std::__cxx11::string::~string((string *)&local_80);
    iVar1 = *(int *)&key_00->field_2;
    if (iVar1 < 0) break;
    iVar3 = QPDFObjectHandle::getArrayNItems(&local_60);
    if (iVar3 <= iVar1) break;
    QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_80,(int)&local_60);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
    bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)this);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"/Kids",(allocator<char> *)&local_50);
      bVar2 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)this,&local_80);
      if (bVar2) {
        std::__cxx11::string::~string((string *)&local_80);
        goto LAB_00126cd1;
      }
      key = (string *)
            (**(code **)*((pe->node).super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_vptr__Sp_counted_base)();
      bVar2 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)this,key);
      std::__cxx11::string::~string((string *)&local_80);
      if (bVar2) goto LAB_00126cd1;
    }
    qpdf = *(QPDF **)&((pe->node).super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_M_use_count;
    std::__cxx11::to_string(&local_50,*(int *)&key_00->field_2);
    std::operator+(&local_80,"skipping over invalid kid at index ",&local_50);
    warn(qpdf,(QPDFObjectHandle *)key_00,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  QPDFObjectHandle::newNull();
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
LAB_00126cd1:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
NNTreeIterator::getNextKid(PathElement& pe, bool backward)
{
    QPDFObjectHandle result;
    bool found = false;
    while (!found) {
        pe.kid_number += backward ? -1 : 1;
        auto kids = pe.node.getKey("/Kids");
        if ((pe.kid_number >= 0) && (pe.kid_number < kids.getArrayNItems())) {
            result = kids.getArrayItem(pe.kid_number);
            if (result.isDictionary() &&
                (result.hasKey("/Kids") || result.hasKey(impl.details.itemsKey()))) {
                found = true;
            } else {
                QTC::TC("qpdf", "NNTree skip invalid kid");
                warn(
                    impl.qpdf,
                    pe.node,
                    ("skipping over invalid kid at index " + std::to_string(pe.kid_number)));
            }
        } else {
            result = QPDFObjectHandle::newNull();
            found = true;
        }
    }
    return result;
}